

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O1

void USPE(double *inp,int N,int p,int q,double *phi,double *theta,double *thetac,double *var)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *acov;
  long lVar5;
  double *A;
  double *b;
  int *ipiv;
  double *__dest;
  undefined8 *__ptr;
  double *array;
  double *__s;
  double *x;
  double *A_00;
  int *ipiv_00;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  uVar9 = (ulong)(uint)q;
  uVar19 = (ulong)(uint)p;
  uVar18 = p + 1;
  iVar3 = p + 1 + q;
  acov = (double *)malloc((long)iVar3 * 8);
  lVar5 = (long)p;
  A = (double *)malloc(lVar5 * 8 * lVar5);
  b = (double *)malloc(lVar5 * 8);
  ipiv = (int *)malloc(lVar5 * 4);
  lVar5 = (long)q;
  sVar1 = lVar5 * 8 + 8;
  __dest = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc((long)(int)uVar18 << 3);
  array = (double *)malloc(sVar1);
  __s = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  A_00 = (double *)malloc((lVar5 + 1) * sVar1);
  ipiv_00 = (int *)malloc(lVar5 * 4 + 4);
  autocovar(inp,N,acov,iVar3);
  dVar20 = mean(inp,N);
  *__ptr = 0xbff0000000000000;
  if (0 < p) {
    memset(phi,0,uVar19 << 3);
  }
  if (0 < q) {
    memset(theta,0,uVar9 * 8);
  }
  if (0 < p) {
    lVar11 = 1;
    uVar7 = uVar9;
    pdVar6 = A;
    do {
      iVar3 = (int)uVar7;
      uVar17 = 0;
      do {
        iVar15 = (int)uVar7;
        uVar12 = (ulong)(uint)-iVar15;
        if (0 < iVar15) {
          uVar12 = uVar7;
        }
        pdVar6[uVar17] = acov[uVar12];
        uVar17 = uVar17 + 1;
        uVar7 = (ulong)(iVar15 - 1);
      } while (uVar19 != uVar17);
      lVar11 = lVar11 + 1;
      pdVar6 = pdVar6 + uVar19;
      uVar7 = (ulong)(iVar3 + 1);
    } while (lVar11 != uVar19 + 1);
    memcpy(b,acov + lVar5 + 1,uVar19 << 3);
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
  }
  if (0 < p) {
    memcpy(__ptr + 1,phi,uVar19 << 3);
  }
  if (p == 0) {
    if (-1 < q) {
      memcpy(__dest,acov,uVar9 * 8 + 8);
    }
  }
  else if (-1 < q) {
    uVar7 = 0;
    do {
      dVar21 = 0.0;
      if (-1 < p) {
        uVar17 = uVar7 & 0xffffffff;
        uVar12 = 0;
        do {
          iVar3 = (int)uVar17;
          uVar14 = 0;
          do {
            iVar15 = (int)uVar17;
            uVar16 = (ulong)(uint)-iVar15;
            if (0 < iVar15) {
              uVar16 = uVar17;
            }
            dVar21 = dVar21 + (double)__ptr[uVar14] * (double)__ptr[uVar12] * acov[uVar16];
            uVar14 = uVar14 + 1;
            uVar17 = (ulong)(iVar15 - 1);
          } while (uVar18 != uVar14);
          uVar12 = uVar12 + 1;
          uVar17 = (ulong)(iVar3 + 1);
        } while (uVar12 != uVar18);
      }
      __dest[uVar7] = dVar21;
      uVar7 = uVar7 + 1;
    } while (uVar7 != q + 1);
  }
  if (-1 < q) {
    sVar1 = uVar9 * 8 + 8;
    memset(__s,0,sVar1);
    memset(array,0,sVar1);
  }
  dVar21 = *__dest;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  uVar18 = q + 1;
  *__s = dVar21;
  if (-1 < q) {
    uVar4 = q + 1;
    uVar7 = (ulong)uVar4;
    uVar17 = 0;
    pdVar6 = __s;
    do {
      if (uVar17 <= uVar9) {
        dVar21 = array[uVar17];
        uVar12 = 0;
        do {
          dVar21 = dVar21 + __s[uVar12] * pdVar6[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
        array[uVar17] = dVar21;
      }
      array[uVar17] = array[uVar17] - __dest[uVar17];
      uVar17 = uVar17 + 1;
      uVar4 = uVar4 - 1;
      pdVar6 = pdVar6 + 1;
    } while (uVar17 != uVar7);
  }
  dVar21 = array_max_abs(array,uVar18);
  uVar9 = (ulong)uVar18;
  if (0.0001 < dVar21) {
    uVar4 = 0;
    do {
      if (-1 < q) {
        lVar11 = 0;
        uVar7 = 0;
        pdVar6 = __s;
        pdVar8 = __s;
        pdVar13 = A_00;
        do {
          uVar17 = 0;
          do {
            dVar21 = 0.0;
            if ((long)(uVar7 + uVar17) <= lVar5) {
              dVar21 = pdVar6[uVar17] + 0.0;
            }
            if (-1 < (long)(lVar11 + uVar17)) {
              dVar21 = dVar21 + pdVar8[uVar17];
            }
            pdVar13[uVar17] = dVar21;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          uVar7 = uVar7 + 1;
          pdVar13 = pdVar13 + uVar9;
          lVar11 = lVar11 + -1;
          pdVar8 = pdVar8 + -1;
          pdVar6 = pdVar6 + 1;
        } while (uVar7 != uVar9);
      }
      ludecomp(A_00,uVar18,ipiv_00);
      linsolve(A_00,uVar18,array,ipiv_00,x);
      if (-1 < q) {
        memset(array,0,uVar9 * 8);
        uVar7 = 0;
        do {
          __s[uVar7] = __s[uVar7] - x[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      if (-1 < q) {
        uVar7 = 0;
        pdVar6 = __s;
        uVar10 = uVar18;
        do {
          if ((long)uVar7 <= lVar5) {
            dVar21 = array[uVar7];
            uVar17 = 0;
            do {
              dVar21 = dVar21 + __s[uVar17] * pdVar6[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
            array[uVar7] = dVar21;
          }
          array[uVar7] = array[uVar7] - __dest[uVar7];
          uVar7 = uVar7 + 1;
          uVar10 = uVar10 - 1;
          pdVar6 = pdVar6 + 1;
        } while (uVar7 != uVar9);
      }
      dVar21 = array_max_abs(array,uVar18);
    } while ((0.0001 < dVar21) && (bVar2 = uVar4 < 199, uVar4 = uVar4 + 1, bVar2));
  }
  *thetac = 0.0;
  if (0 < p) {
    dVar21 = 0.0;
    uVar7 = 0;
    do {
      dVar21 = dVar21 + (double)__ptr[uVar7 + 1];
      uVar7 = uVar7 + 1;
    } while (uVar19 != uVar7);
    dVar20 = dVar20 * (1.0 - dVar21);
  }
  *thetac = dVar20;
  if (0 < q) {
    dVar20 = *__s;
    lVar5 = 0;
    do {
      theta[lVar5] = -__s[lVar5 + 1] / dVar20;
      lVar5 = lVar5 + 1;
    } while (uVar9 - 1 != lVar5);
  }
  *var = *__s * *__s;
  if (q == 0) {
    if (p < 1) {
      dVar20 = 0.0;
    }
    else {
      dVar20 = 0.0;
      uVar9 = 0;
      do {
        lVar5 = uVar9 + 1;
        lVar11 = uVar9 + 1;
        uVar9 = uVar9 + 1;
        dVar20 = dVar20 + acov[lVar5] * (double)__ptr[lVar11];
      } while (uVar19 != uVar9);
    }
    *var = *acov - dVar20;
  }
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__dest);
  free(__ptr);
  free(array);
  free(__s);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE(double *inp,int N,int p, int q, double *phi,double *theta,double *thetac,double *var) {
	int K,i,j,l,t,temp,it1;
	double wmean,tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h;
	int *ipiv,*ipiv2;

	K = p + q + 1;

	c = (double *) malloc(sizeof(double) * K);
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,c,K);
	wmean = mean(inp,N);
	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	*thetac = 0.0;

	if (p > 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd += x[i+1];
		}
		*thetac = wmean * (1.0 - tempd);
	} else {
		*thetac = wmean;
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}

	*var = tau[0] * tau[0];

	if (q == 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd = tempd + c[i+1] * x[i+1];
		}
		*var = c[0] - tempd;
	}

	free(c);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);
}